

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_extract2(REF_DBL *m,REF_DBL *r,REF_DBL *s,REF_DBL *e)

{
  int local_ac;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL m3 [6];
  REF_DBL q [9];
  REF_DBL *e_local;
  REF_DBL *s_local;
  REF_DBL *r_local;
  REF_DBL *m_local;
  
  for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
    m3[(long)local_ac + 5] = r[local_ac];
  }
  for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
    m3[(long)(local_ac + 3) + 5] = s[local_ac];
  }
  for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
    m3[(long)(local_ac + 6) + 5] = 0.0;
  }
  m_local._4_4_ = ref_matrix_jac_m_jact(m3 + 5,m,(REF_DBL *)&ref_private_macro_code_rss);
  if (m_local._4_4_ == 0) {
    *e = _ref_private_macro_code_rss;
    e[1] = m3[0];
    e[2] = m3[2];
    m_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x54d,
           "ref_matrix_extract2",(ulong)m_local._4_4_,"trans");
  }
  return m_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_extract2(REF_DBL *m, REF_DBL *r, REF_DBL *s,
                                       REF_DBL *e) {
  REF_DBL q[9];
  REF_DBL m3[6];
  REF_INT i;
  for (i = 0; i < 3; i++) q[i] = r[i];
  for (i = 0; i < 3; i++) q[i + 3] = s[i];
  for (i = 0; i < 3; i++) q[i + 6] = 0;
  RSS(ref_matrix_jac_m_jact(q, m, m3), "trans");
  e[0] = m3[0];
  e[1] = m3[1];
  e[2] = m3[3];
  return REF_SUCCESS;
}